

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_parse.c
# Opt level: O0

MPP_RET avsd_set_dpb(AvsdCtx_t *p_dec,HalDecTask *task)

{
  AvsdFrame_t *pAVar1;
  RK_U32 RVar2;
  RK_S64 RVar3;
  AvsdFrame_t *p_cur;
  MppFrame pvStack_28;
  RK_S32 slot_idx;
  MppFrame mframe;
  HalDecTask *task_local;
  AvsdCtx_t *p_dec_local;
  
  pvStack_28 = (MppFrame)0x0;
  p_cur._4_4_ = -1;
  pAVar1 = p_dec->cur;
  mframe = task;
  task_local = (HalDecTask *)p_dec;
  mpp_buf_slot_get_unused(p_dec->frame_slots,(RK_S32 *)((long)&p_cur + 4));
  if (p_cur._4_4_ < 0) {
    if ((avsd_parse_debug & 4) != 0) {
      _mpp_log_l(4,"avsd_parse","error, buf_slot has not get.\n",(char *)0x0);
    }
    p_dec_local._4_4_ = MPP_NOK;
  }
  else {
    pAVar1->slot_idx = p_cur._4_4_;
    pAVar1->pic_type = (uint)(byte)task_local[1].output;
    pAVar1->width = task_local->refer[0x10];
    pAVar1->height = *(RK_U32 *)&task_local->field_0x7c;
    pAVar1->hor_stride = task_local->refer[0x10] + 0xfU & 0xfffffff0;
    pAVar1->ver_stride = *(int *)&task_local->field_0x7c + 0xfU & 0xfffffff0;
    RVar3 = mpp_packet_get_pts(*(MppPacket *)((long)mframe + 0x20));
    pAVar1->pts = RVar3;
    RVar3 = mpp_packet_get_dts(*(MppPacket *)((long)mframe + 0x20));
    pAVar1->dts = RVar3;
    mpp_frame_init(&stack0xffffffffffffffd8);
    mpp_frame_set_fmt(pvStack_28,MPP_FMT_YUV420SP);
    mpp_frame_set_hor_stride(pvStack_28,pAVar1->hor_stride);
    mpp_frame_set_ver_stride(pvStack_28,pAVar1->ver_stride);
    mpp_frame_set_width(pvStack_28,pAVar1->width);
    mpp_frame_set_height(pvStack_28,pAVar1->height);
    mpp_frame_set_pts(pvStack_28,pAVar1->pts);
    mpp_frame_set_dts(pvStack_28,pAVar1->dts);
    if (*(char *)((long)task_local[1].refer + 0xd) == '\0') {
      pAVar1->frame_mode = 0;
      if ((*(uint *)(*(long *)task_local->refer + 0x34) & 2) != 0) {
        pAVar1->frame_mode = pAVar1->frame_mode | 0xc;
      }
    }
    else {
      pAVar1->frame_mode = 3;
      if (*(char *)((long)task_local[1].refer + 0xf) == '\0') {
        pAVar1->frame_mode = pAVar1->frame_mode | 8;
      }
      else {
        pAVar1->frame_mode = pAVar1->frame_mode | 4;
      }
    }
    mpp_frame_set_mode(pvStack_28,pAVar1->frame_mode);
    mpp_buf_slot_set_prop(*(MppBufSlots *)task_local,p_cur._4_4_,SLOT_FRAME,pvStack_28);
    mpp_frame_deinit(&stack0xffffffffffffffd8);
    mpp_buf_slot_set_flag(*(MppBufSlots *)task_local,pAVar1->slot_idx,SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(*(MppBufSlots *)task_local,pAVar1->slot_idx,SLOT_HAL_OUTPUT);
    *(undefined4 *)((long)mframe + 0x34) =
         *(undefined4 *)(*(long *)(task_local[2].refer + 8) + 0x3c);
    if (((*(long *)(task_local[2].refer + 4) != 0) &&
        (-1 < *(int *)(*(long *)(task_local[2].refer + 4) + 0x3c))) &&
       (*(int *)(*(long *)(task_local[2].refer + 4) + 0x3c) !=
        *(int *)(*(long *)(task_local[2].refer + 8) + 0x3c))) {
      mpp_buf_slot_set_flag
                (*(MppBufSlots *)task_local,*(RK_S32 *)(*(long *)(task_local[2].refer + 4) + 0x3c),
                 SLOT_HAL_INPUT);
      if ((char)task_local[1].output == '\x02') {
        *(undefined4 *)((long)mframe + 0x3c) =
             *(undefined4 *)(*(long *)(task_local[2].refer + 4) + 0x3c);
      }
      else {
        *(undefined4 *)((long)mframe + 0x38) =
             *(undefined4 *)(*(long *)(task_local[2].refer + 4) + 0x3c);
      }
    }
    if (((*(long *)(task_local[2].refer + 6) != 0) &&
        (-1 < *(int *)(*(long *)(task_local[2].refer + 6) + 0x3c))) &&
       (*(int *)(*(long *)(task_local[2].refer + 6) + 0x3c) !=
        *(int *)(*(long *)(task_local[2].refer + 8) + 0x3c))) {
      mpp_buf_slot_set_flag
                (*(MppBufSlots *)task_local,*(RK_S32 *)(*(long *)(task_local[2].refer + 6) + 0x3c),
                 SLOT_HAL_INPUT);
      if ((char)task_local[1].output == '\x02') {
        *(undefined4 *)((long)mframe + 0x38) =
             *(undefined4 *)(*(long *)(task_local[2].refer + 6) + 0x3c);
      }
      else {
        *(undefined4 *)((long)mframe + 0x3c) =
             *(undefined4 *)(*(long *)(task_local[2].refer + 6) + 0x3c);
      }
    }
    if ((char)task_local[1].output == '\0') {
      *(ulong *)((long)mframe + 8) = *(ulong *)((long)mframe + 8) & 0xffffffffffffffef | 0x10;
      *(ulong *)((long)mframe + 8) = *(ulong *)((long)mframe + 8) & 0xfffffffffffffff7;
    }
    else if ((char)task_local[1].output == '\x01') {
      *(ulong *)((long)mframe + 8) = *(ulong *)((long)mframe + 8) & 0xffffffffffffffef | 0x10;
      if ((-1 < *(int *)((long)mframe + 0x38)) &&
         (mpp_buf_slot_get_prop
                    (*(MppBufSlots *)task_local,*(RK_S32 *)((long)mframe + 0x38),SLOT_FRAME_PTR,
                     &stack0xffffffffffffffd8), pvStack_28 != (MppFrame)0x0)) {
        RVar2 = mpp_frame_get_errinfo(pvStack_28);
        *(ulong *)((long)mframe + 8) =
             *(ulong *)((long)mframe + 8) & 0xfffffffffffffff7 |
             ((ulong)((uint)(*(ulong *)((long)mframe + 8) >> 3) & 1 | RVar2) & 1) << 3;
      }
    }
    else if ((char)task_local[1].output == '\x02') {
      *(ulong *)((long)mframe + 8) = *(ulong *)((long)mframe + 8) & 0xffffffffffffffef;
      if ((-1 < *(int *)((long)mframe + 0x38)) &&
         (mpp_buf_slot_get_prop
                    (*(MppBufSlots *)task_local,*(RK_S32 *)((long)mframe + 0x38),SLOT_FRAME_PTR,
                     &stack0xffffffffffffffd8), pvStack_28 != (MppFrame)0x0)) {
        RVar2 = mpp_frame_get_errinfo(pvStack_28);
        *(ulong *)((long)mframe + 8) =
             *(ulong *)((long)mframe + 8) & 0xfffffffffffffff7 |
             ((ulong)((uint)(*(ulong *)((long)mframe + 8) >> 3) & 1 | RVar2) & 1) << 3;
      }
      if ((-1 < *(int *)((long)mframe + 0x3c)) &&
         (mpp_buf_slot_get_prop
                    (*(MppBufSlots *)task_local,*(RK_S32 *)((long)mframe + 0x3c),SLOT_FRAME_PTR,
                     &stack0xffffffffffffffd8), pvStack_28 != (MppFrame)0x0)) {
        RVar2 = mpp_frame_get_errinfo(pvStack_28);
        *(ulong *)((long)mframe + 8) =
             *(ulong *)((long)mframe + 8) & 0xfffffffffffffff7 |
             ((ulong)((uint)(*(ulong *)((long)mframe + 8) >> 3) & 1 | RVar2) & 1) << 3;
      }
    }
    p_dec_local._4_4_ = MPP_OK;
  }
  return p_dec_local._4_4_;
}

Assistant:

MPP_RET avsd_set_dpb(AvsdCtx_t *p_dec, HalDecTask *task)
{
    MppFrame mframe = NULL;
    RK_S32 slot_idx = -1;
    AvsdFrame_t *p_cur = p_dec->cur;

    //!< set current dpb for decode
    mpp_buf_slot_get_unused(p_dec->frame_slots, &slot_idx);
    if (slot_idx < 0) {
        AVSD_DBG(AVSD_DBG_WARNNING, "error, buf_slot has not get.\n");
        goto __FAILED;
    }
    //!< init current frame data
    p_cur->slot_idx = slot_idx;
    p_cur->pic_type = p_dec->ph.picture_coding_type;
    p_cur->width = p_dec->vsh.horizontal_size;
    p_cur->height = p_dec->vsh.vertical_size;
    p_cur->hor_stride = MPP_ALIGN(p_dec->vsh.horizontal_size, 16);
    p_cur->ver_stride = MPP_ALIGN(p_dec->vsh.vertical_size, 16);
    p_cur->pts = mpp_packet_get_pts(task->input_packet);
    p_cur->dts = mpp_packet_get_dts(task->input_packet);
    //!< set frame info
    mpp_frame_init(&mframe);
    mpp_frame_set_fmt(mframe, MPP_FMT_YUV420SP);
    mpp_frame_set_hor_stride(mframe, p_cur->hor_stride);  // before crop
    mpp_frame_set_ver_stride(mframe, p_cur->ver_stride);
    mpp_frame_set_width(mframe, p_cur->width);  // after crop
    mpp_frame_set_height(mframe, p_cur->height);
    mpp_frame_set_pts(mframe, p_cur->pts);
    mpp_frame_set_dts(mframe, p_cur->dts);
    if (p_dec->ph.picture_structure) { //!< data combine 2 field
        p_cur->frame_mode = MPP_FRAME_FLAG_PAIRED_FIELD;
        if (p_dec->ph.top_field_first) {
            p_cur->frame_mode |= MPP_FRAME_FLAG_TOP_FIRST;
        } else {
            p_cur->frame_mode |= MPP_FRAME_FLAG_BOT_FIRST;
        }
    } else { //!< frame picture
        p_cur->frame_mode = MPP_FRAME_FLAG_FRAME;

        if (p_dec->init.cfg->base.enable_vproc & MPP_VPROC_MODE_DETECTION) {
            p_cur->frame_mode |= MPP_FRAME_FLAG_DEINTERLACED;
        }
    }
    mpp_frame_set_mode(mframe, p_cur->frame_mode);
    mpp_buf_slot_set_prop(p_dec->frame_slots, slot_idx, SLOT_FRAME, mframe);
    mpp_frame_deinit(&mframe);

    mpp_buf_slot_set_flag(p_dec->frame_slots, p_cur->slot_idx, SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p_cur->slot_idx, SLOT_HAL_OUTPUT);

    //!< set task
    task->output = p_dec->cur->slot_idx;
    //!< set task refers
    if (p_dec->dpb[0] && p_dec->dpb[0]->slot_idx >= 0 &&
        (p_dec->dpb[0]->slot_idx != p_dec->cur->slot_idx)) {
        mpp_buf_slot_set_flag(p_dec->frame_slots, p_dec->dpb[0]->slot_idx, SLOT_HAL_INPUT);
        if (p_dec->ph.picture_coding_type == B_PICTURE) {
            task->refer[1] = p_dec->dpb[0]->slot_idx;
        } else {
            task->refer[0] = p_dec->dpb[0]->slot_idx;
        }
    }
    if (p_dec->dpb[1] && p_dec->dpb[1]->slot_idx >= 0 &&
        (p_dec->dpb[1]->slot_idx != p_dec->cur->slot_idx)) {
        mpp_buf_slot_set_flag(p_dec->frame_slots, p_dec->dpb[1]->slot_idx, SLOT_HAL_INPUT);
        if (p_dec->ph.picture_coding_type == B_PICTURE) {
            task->refer[0] = p_dec->dpb[1]->slot_idx;
        } else {
            task->refer[1] = p_dec->dpb[1]->slot_idx;
        }
    }

    //!< set ref flag and mark error
    if (p_dec->ph.picture_coding_type == I_PICTURE) {
        task->flags.used_for_ref = 1;
        task->flags.ref_err = 0;
    } else if (p_dec->ph.picture_coding_type == P_PICTURE) {
        task->flags.used_for_ref = 1;
        if (task->refer[0] >= 0) {
            mpp_buf_slot_get_prop(p_dec->frame_slots, task->refer[0], SLOT_FRAME_PTR, &mframe);
            if (mframe)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        }
    } else if (p_dec->ph.picture_coding_type == B_PICTURE) {
        task->flags.used_for_ref = 0;
        if (task->refer[0] >= 0) {
            mpp_buf_slot_get_prop(p_dec->frame_slots, task->refer[0], SLOT_FRAME_PTR, &mframe);
            if (mframe)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        }
        if (task->refer[1] >= 0) {
            mpp_buf_slot_get_prop(p_dec->frame_slots, task->refer[1], SLOT_FRAME_PTR, &mframe);
            if (mframe)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        }
    }

    return MPP_OK;
__FAILED:
    return MPP_NOK;
}